

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast2json.cc
# Opt level: O1

int ProgramMain(int argc,char **argv)

{
  ValidateOptions *options;
  string *psVar1;
  string *header;
  WastParseOptions *options_00;
  Script *script_00;
  char *pcVar2;
  pointer pLVar3;
  _Head_base<0UL,_wabt::LexerSource_*,_false> _Var4;
  pointer pRVar5;
  OutputBuffer *this;
  LexerSourceLineFinder *line_finder_00;
  char *pcVar6;
  Result RVar7;
  wabt *pwVar8;
  size_t sVar9;
  Callback *callback;
  char *extraout_RDX;
  char *extraout_RDX_00;
  int iVar10;
  pointer *unaff_RBX;
  pointer *__ptr;
  ulong unaff_RBP;
  pointer *ppLVar11;
  pointer unaff_R12;
  pointer *unaff_R13;
  FilenameMemoryStreamPair *pair;
  pointer pLVar12;
  char *unaff_R15;
  string_view filename;
  string_view filename_00;
  string_view filename_01;
  string_view filename_02;
  string_view filename_03;
  string_view filename_04;
  string_view sVar13;
  string_view source_filename;
  string_view module_filename_noext;
  unique_ptr<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
  line_finder;
  unique_ptr<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_> lexer;
  unique_ptr<wabt::Script,_std::default_delete<wabt::Script>_> script;
  Errors errors;
  OptionParser parser;
  vector<wabt::FilenameMemoryStreamPair,_std::allocator<wabt::FilenameMemoryStreamPair>_>
  module_streams;
  vector<unsigned_char,_std::allocator<unsigned_char>_> file_data;
  WastParseOptions parse_wast_options;
  
  ppLVar11 = (pointer *)(ulong)(uint)argc;
  __ptr = (pointer *)register0x00000020;
  while( true ) {
    __ptr = __ptr + -1;
    *__ptr = (pointer)unaff_RBP;
    __ptr[-2] = (pointer)unaff_R15;
    __ptr[-3] = (pointer)pair;
    __ptr[-4] = (pointer)unaff_R13;
    __ptr[-5] = unaff_R12;
    __ptr[-6] = (pointer)unaff_RBX;
    __ptr[-0x2e] = (pointer)0x11e867;
    wabt::InitStdio();
    __ptr[-0x2e] = (pointer)0x11e882;
    wabt::OptionParser::OptionParser
              ((OptionParser *)(__ptr + -0x23),"wast2json",
               "  read a file in the wasm spec test format, check it for errors, and\n  convert it to a JSON file and associated wasm binary files.\n\nexamples:\n  # parse spec-test.wast, and write files to spec-test.json. Modules are\n  # written to spec-test.0.wasm, spec-test.1.wasm, etc.\n  $ wast2json spec-test.wast -o spec-test.json\n"
              );
    __ptr[-0x2d] = (pointer)0x0;
    __ptr[-0x2c] = (pointer)0x0;
    __ptr[-0x2a] = (pointer)std::
                            _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/tools/wast2json.cc:64:72)>
                            ::_M_invoke;
    __ptr[-0x2b] = (pointer)std::
                            _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/tools/wast2json.cc:64:72)>
                            ::_M_manager;
    __ptr[-0x2e] = (pointer)0x11e8c0;
    wabt::OptionParser::AddOption
              ((OptionParser *)(__ptr + -0x23),'v',"verbose","Use multiple times for more info",
               (NullCallback *)(__ptr + -0x2d));
    if (__ptr[-0x2b] != (pointer)0x0) {
      __ptr[-0x2e] = (pointer)0x11e8d6;
      (*(code *)__ptr[-0x2b])(__ptr + -0x2d,__ptr + -0x2d,3);
    }
    __ptr[-0x2d] = (pointer)0x0;
    __ptr[-0x2c] = (pointer)0x0;
    __ptr[-0x2a] = (pointer)std::
                            _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/tools/wast2json.cc:69:20)>
                            ::_M_invoke;
    __ptr[-0x2b] = (pointer)std::
                            _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/tools/wast2json.cc:69:20)>
                            ::_M_manager;
    __ptr[-0x2e] = (pointer)0x11e911;
    wabt::OptionParser::AddOption
              ((OptionParser *)(__ptr + -0x23),"debug-parser",
               "Turn on debugging the parser of wast files",(NullCallback *)(__ptr + -0x2d));
    if (__ptr[-0x2b] != (pointer)0x0) {
      __ptr[-0x2e] = (pointer)0x11e927;
      (*(code *)__ptr[-0x2b])(__ptr + -0x2d,__ptr + -0x2d,3);
    }
    __ptr[-0x2e] = (pointer)0x11e93b;
    wabt::Features::AddOptions(&s_features,(OptionParser *)(__ptr + -0x23));
    __ptr[-0x2d] = (pointer)0x0;
    __ptr[-0x2c] = (pointer)0x0;
    __ptr[-0x2a] = (pointer)std::
                            _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/tools/wast2json.cc:72:20)>
                            ::_M_invoke;
    __ptr[-0x2b] = (pointer)std::
                            _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/tools/wast2json.cc:72:20)>
                            ::_M_manager;
    __ptr[-0x2e] = (pointer)0x11e980;
    wabt::OptionParser::AddOption
              ((OptionParser *)(__ptr + -0x23),'o',"output","FILE","output JSON file",
               (Callback *)(__ptr + -0x2d));
    if (__ptr[-0x2b] != (pointer)0x0) {
      __ptr[-0x2e] = (pointer)0x11e996;
      (*(code *)__ptr[-0x2b])(__ptr + -0x2d,__ptr + -0x2d,3);
    }
    __ptr[-0x2d] = (pointer)0x0;
    __ptr[-0x2c] = (pointer)0x0;
    __ptr[-0x2a] = (pointer)std::
                            _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/tools/wast2json.cc:76:7)>
                            ::_M_invoke;
    __ptr[-0x2b] = (pointer)std::
                            _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/tools/wast2json.cc:76:7)>
                            ::_M_manager;
    __ptr[-0x2e] = (pointer)0x11e9d6;
    wabt::OptionParser::AddOption
              ((OptionParser *)(__ptr + -0x23),'r',"relocatable",
               "Create a relocatable wasm binary (suitable for linking with e.g. lld)",
               (NullCallback *)(__ptr + -0x2d));
    if (__ptr[-0x2b] != (pointer)0x0) {
      __ptr[-0x2e] = (pointer)0x11e9ec;
      (*(code *)__ptr[-0x2b])(__ptr + -0x2d,__ptr + -0x2d,3);
    }
    __ptr[-0x2d] = (pointer)0x0;
    __ptr[-0x2c] = (pointer)0x0;
    __ptr[-0x2a] = (pointer)std::
                            _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/tools/wast2json.cc:80:7)>
                            ::_M_invoke;
    __ptr[-0x2b] = (pointer)std::
                            _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/tools/wast2json.cc:80:7)>
                            ::_M_manager;
    __ptr[-0x2e] = (pointer)0x11ea27;
    wabt::OptionParser::AddOption
              ((OptionParser *)(__ptr + -0x23),"no-canonicalize-leb128s",
               "Write all LEB128 sizes as 5-bytes instead of their minimal size",
               (NullCallback *)(__ptr + -0x2d));
    if (__ptr[-0x2b] != (pointer)0x0) {
      __ptr[-0x2e] = (pointer)0x11ea3d;
      (*(code *)__ptr[-0x2b])(__ptr + -0x2d,__ptr + -0x2d,3);
    }
    __ptr[-0x2d] = (pointer)0x0;
    __ptr[-0x2c] = (pointer)0x0;
    __ptr[-0x2a] = (pointer)std::
                            _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/tools/wast2json.cc:83:20)>
                            ::_M_invoke;
    __ptr[-0x2b] = (pointer)std::
                            _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/tools/wast2json.cc:83:20)>
                            ::_M_manager;
    __ptr[-0x2e] = (pointer)0x11ea78;
    wabt::OptionParser::AddOption
              ((OptionParser *)(__ptr + -0x23),"debug-names",
               "Write debug names to the generated binary file",(NullCallback *)(__ptr + -0x2d));
    if (__ptr[-0x2b] != (pointer)0x0) {
      __ptr[-0x2e] = (pointer)0x11ea8e;
      (*(code *)__ptr[-0x2b])(__ptr + -0x2d,__ptr + -0x2d,3);
    }
    __ptr[-0x2d] = (pointer)0x0;
    __ptr[-0x2c] = (pointer)0x0;
    __ptr[-0x2a] = (pointer)std::
                            _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/tools/wast2json.cc:85:20)>
                            ::_M_invoke;
    __ptr[-0x2b] = (pointer)std::
                            _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/tools/wast2json.cc:85:20)>
                            ::_M_manager;
    __ptr[-0x2e] = (pointer)0x11eac9;
    wabt::OptionParser::AddOption
              ((OptionParser *)(__ptr + -0x23),"no-check","Don\'t check for invalid modules",
               (NullCallback *)(__ptr + -0x2d));
    if (__ptr[-0x2b] != (pointer)0x0) {
      __ptr[-0x2e] = (pointer)0x11eadf;
      (*(code *)__ptr[-0x2b])(__ptr + -0x2d,__ptr + -0x2d,3);
    }
    unaff_R13 = __ptr + -0x2b;
    __ptr[-0x2d] = (pointer)unaff_R13;
    *unaff_R13 = (pointer)0x656d616e656c6966;
    __ptr[-0x2c] = (pointer)0x8;
    *(undefined1 *)(__ptr + -0x2a) = 0;
    callback = (Callback *)(__ptr + -0xd);
    *(undefined8 *)&(callback->super__Function_base)._M_functor = 0;
    __ptr[-0xc] = (pointer)0x0;
    __ptr[-10] = (pointer)std::
                          _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/tools/wast2json.cc:87:22)>
                          ::_M_invoke;
    __ptr[-0xb] = (pointer)std::
                           _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/tools/wast2json.cc:87:22)>
                           ::_M_manager;
    __ptr[-0x2e] = (pointer)0x11eb3a;
    wabt::OptionParser::AddArgument
              ((OptionParser *)(__ptr + -0x23),(string *)(__ptr + -0x2d),One,callback);
    if (__ptr[-0xb] != (pointer)0x0) {
      __ptr[-0x2e] = (pointer)0x11eb55;
      (*(code *)__ptr[-0xb])(__ptr + -0xd,__ptr + -0xd,3);
    }
    if (__ptr[-0x2d] != (pointer)unaff_R13) {
      __ptr[-0x2e] = (pointer)0x11eb6b;
      operator_delete(__ptr[-0x2d],
                      (ulong)((long)&(__ptr[-0x2b]->source_)._M_t.
                                     super___uniq_ptr_impl<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_wabt::LexerSource_*,_std::default_delete<wabt::LexerSource>_>
                                     .super__Head_base<0UL,_wabt::LexerSource_*,_false>._M_head_impl
                             + 1));
    }
    __ptr[-0x2e] = (pointer)0x11eb7d;
    wabt::OptionParser::Parse((OptionParser *)(__ptr + -0x23),(int)ppLVar11,argv);
    if (__ptr[-0x13] != (pointer)0x0) {
      __ptr[-0x2e] = (pointer)0x11eb9b;
      (*(code *)__ptr[-0x13])(__ptr + -0x15,__ptr + -0x15,3);
    }
    __ptr[-0x2e] = (pointer)0x11eba8;
    std::vector<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>::
    ~vector((vector<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_> *)
            (__ptr + -0x18));
    __ptr[-0x2e] = (pointer)0x11ebb8;
    std::vector<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_>::~vector
              ((vector<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_> *)
               (__ptr + -0x1b));
    if (__ptr[-0x1f] != (pointer)(__ptr + -0x1d)) {
      __ptr[-0x2e] = (pointer)0x11ebd9;
      operator_delete(__ptr[-0x1f],
                      (ulong)((long)&(__ptr[-0x1d]->source_)._M_t.
                                     super___uniq_ptr_impl<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_wabt::LexerSource_*,_std::default_delete<wabt::LexerSource>_>
                                     .super__Head_base<0UL,_wabt::LexerSource_*,_false>._M_head_impl
                             + 1));
    }
    unaff_R12 = (pointer)(__ptr + -0x21);
    if (__ptr[-0x23] != unaff_R12) {
      __ptr[-0x2e] = (pointer)0x11ebf5;
      operator_delete(__ptr[-0x23],
                      (ulong)((long)&(__ptr[-0x21]->source_)._M_t.
                                     super___uniq_ptr_impl<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_wabt::LexerSource_*,_std::default_delete<wabt::LexerSource>_>
                                     .super__Head_base<0UL,_wabt::LexerSource_*,_false>._M_head_impl
                             + 1));
    }
    pcVar2 = s_infile;
    unaff_RBX = __ptr + -0xd;
    __ptr[-0xb] = (pointer)0x0;
    *unaff_RBX = (pointer)0x0;
    __ptr[-0xc] = (pointer)0x0;
    __ptr[-0x2e] = (pointer)0x11ec19;
    pwVar8 = (wabt *)strlen(s_infile);
    __ptr[-0x2e] = (pointer)0x11ec27;
    sVar13._M_str = (char *)unaff_RBX;
    sVar13._M_len = (size_t)pcVar2;
    RVar7 = wabt::ReadFile(pwVar8,sVar13,
                           (vector<unsigned_char,_std::allocator<unsigned_char>_> *)callback);
    unaff_R15 = s_infile;
    unaff_RBP = (ulong)RVar7.enum_;
    pair = (FilenameMemoryStreamPair *)(__ptr + -0x27);
    __ptr[-0x25] = (pointer)0x0;
    (pair->filename)._M_dataplus._M_p = (pointer)0x0;
    __ptr[-0x26] = (pointer)0x0;
    __ptr[-0x2e] = (pointer)0x11ec48;
    argv = (char **)strlen(s_infile);
    ppLVar11 = __ptr + -0x29;
    __ptr[-0x2e] = (pointer)0x11ec65;
    filename_04._M_str = (char *)argv;
    filename_04._M_len = (size_t)ppLVar11;
    wabt::WastLexer::CreateBufferLexer
              (filename_04,unaff_R15,(size_t)*unaff_RBX,
               (Errors *)((long)__ptr[-0xc] - (long)*unaff_RBX));
    if (RVar7.enum_ != Error) break;
    __ptr[-0x2e] = (pointer)main;
    ProgramMain();
    __ptr = __ptr + -0x2d;
  }
  (((unique_ptr<wabt::Script,_std::default_delete<wabt::Script>_> *)(__ptr + -0x28))->_M_t).
  super___uniq_ptr_impl<wabt::Script,_std::default_delete<wabt::Script>_>._M_t.
  super__Tuple_impl<0UL,_wabt::Script_*,_std::default_delete<wabt::Script>_>.
  super__Head_base<0UL,_wabt::Script_*,_false>._M_head_impl = (Script *)0x0;
  options_00 = (WastParseOptions *)(__ptr + -9);
  *(undefined2 *)(__ptr + -7) = s_features._16_2_;
  (options_00->features).exceptions_enabled_ = s_features.exceptions_enabled_;
  (options_00->features).mutable_globals_enabled_ = s_features.mutable_globals_enabled_;
  (options_00->features).sat_float_to_int_enabled_ = s_features.sat_float_to_int_enabled_;
  (options_00->features).sign_extension_enabled_ = s_features.sign_extension_enabled_;
  (options_00->features).simd_enabled_ = s_features.simd_enabled_;
  (options_00->features).threads_enabled_ = s_features.threads_enabled_;
  (options_00->features).function_references_enabled_ = s_features.function_references_enabled_;
  (options_00->features).multi_value_enabled_ = s_features.multi_value_enabled_;
  __ptr[-8] = (pointer)s_features._8_8_;
  *(undefined1 *)((long)__ptr + -0x36) = 0;
  __ptr[-0x2e] = (pointer)0x11ecaa;
  RVar7 = wabt::ParseWastScript
                    ((WastLexer *)__ptr[-0x29],
                     (unique_ptr<wabt::Script,_std::default_delete<wabt::Script>_> *)(__ptr + -0x28)
                     ,(Errors *)(__ptr + -0x27),options_00);
  iVar10 = 1;
  if (RVar7.enum_ == Ok) {
    if (s_validate == '\0') {
      options = (ValidateOptions *)(__ptr + -0x23);
      *(undefined2 *)(__ptr + -0x21) = s_features._16_2_;
      (options->features).exceptions_enabled_ = s_features.exceptions_enabled_;
      (options->features).mutable_globals_enabled_ = s_features.mutable_globals_enabled_;
      (options->features).sat_float_to_int_enabled_ = s_features.sat_float_to_int_enabled_;
      (options->features).sign_extension_enabled_ = s_features.sign_extension_enabled_;
      (options->features).simd_enabled_ = s_features.simd_enabled_;
      (options->features).threads_enabled_ = s_features.threads_enabled_;
      (options->features).function_references_enabled_ = s_features.function_references_enabled_;
      (options->features).multi_value_enabled_ = s_features.multi_value_enabled_;
      __ptr[-0x22] = (pointer)s_features._8_8_;
      __ptr[-0x2e] = (pointer)0x11ece9;
      RVar7 = wabt::ValidateScript((Script *)__ptr[-0x28],(Errors *)(__ptr + -0x27),options);
      if (RVar7.enum_ != Ok) goto LAB_0011eec8;
    }
    pcVar2 = s_infile;
    if (s_outfile_abi_cxx11_._M_string_length == 0) {
      __ptr[-0x2e] = (pointer)0x11ed0a;
      pwVar8 = (wabt *)strlen(s_infile);
      __ptr[-0x2e] = (pointer)0x11ed15;
      filename._M_str = extraout_RDX;
      filename._M_len = (size_t)pcVar2;
      sVar13 = wabt::GetBasename(pwVar8,filename);
      filename_00._M_str = sVar13._M_str;
      __ptr[-0x2e] = (pointer)0x11ed20;
      filename_00._M_len = (size_t)filename_00._M_str;
      sVar13 = wabt::StripExtension((wabt *)sVar13._M_len,filename_00);
      psVar1 = (string *)(__ptr + -0x23);
      *(pointer *)psVar1 = unaff_R12;
      __ptr[-0x2e] = (pointer)0x11ed39;
      std::__cxx11::string::_M_construct<char_const*>
                (psVar1,sVar13._M_str,sVar13._M_str + sVar13._M_len);
      __ptr[-0x2e] = (pointer)0x11ed48;
      std::__cxx11::string::append((char *)psVar1);
      __ptr[-0x2e] = (pointer)0x11ed57;
      std::__cxx11::string::operator=((string *)&s_outfile_abi_cxx11_,psVar1);
      if (*(pointer *)psVar1 != unaff_R12) {
        __ptr[-0x2e] = (pointer)0x11ed6c;
        operator_delete(*(pointer *)psVar1,
                        (ulong)((long)&(__ptr[-0x21]->source_)._M_t.
                                       super___uniq_ptr_impl<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_wabt::LexerSource_*,_std::default_delete<wabt::LexerSource>_>
                                       .super__Head_base<0UL,_wabt::LexerSource_*,_false>.
                                       _M_head_impl + 1));
      }
    }
    __ptr[-0x11] = (pointer)0x0;
    __ptr[-0x10] = (pointer)0x0;
    __ptr[-0xf] = (pointer)0x0;
    __ptr[-0x2e] = (pointer)0x11ed92;
    wabt::MemoryStream::MemoryStream((MemoryStream *)(__ptr + -0x23),(Stream *)0x0);
    __ptr[-0x2e] = (pointer)0x11eda5;
    filename_01._M_str = extraout_RDX_00;
    filename_01._M_len = (size_t)s_outfile_abi_cxx11_._M_dataplus._M_p;
    sVar13 = wabt::StripExtension((wabt *)s_outfile_abi_cxx11_._M_string_length,filename_01);
    __ptr[-0x2d] = (pointer)unaff_R13;
    __ptr[-0x2e] = (pointer)0x11edbc;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(__ptr + -0x2d),sVar13._M_str,sVar13._M_str + sVar13._M_len);
    pcVar6 = s_infile;
    s_write_binary_options.features.extended_const_enabled_ = s_features.extended_const_enabled_;
    s_write_binary_options.features.relaxed_simd_enabled_ = s_features.relaxed_simd_enabled_;
    s_write_binary_options.features.exceptions_enabled_ = s_features.exceptions_enabled_;
    s_write_binary_options.features.mutable_globals_enabled_ = s_features.mutable_globals_enabled_;
    s_write_binary_options.features.sat_float_to_int_enabled_ = s_features.sat_float_to_int_enabled_
    ;
    s_write_binary_options.features.sign_extension_enabled_ = s_features.sign_extension_enabled_;
    s_write_binary_options.features.simd_enabled_ = s_features.simd_enabled_;
    s_write_binary_options.features.threads_enabled_ = s_features.threads_enabled_;
    s_write_binary_options.features.function_references_enabled_ =
         s_features.function_references_enabled_;
    s_write_binary_options.features.multi_value_enabled_ = s_features.multi_value_enabled_;
    s_write_binary_options.features.tail_call_enabled_ = s_features.tail_call_enabled_;
    s_write_binary_options.features.bulk_memory_enabled_ = s_features.bulk_memory_enabled_;
    s_write_binary_options.features.reference_types_enabled_ = s_features.reference_types_enabled_;
    s_write_binary_options.features.annotations_enabled_ = s_features.annotations_enabled_;
    s_write_binary_options.features.code_metadata_enabled_ = s_features.code_metadata_enabled_;
    s_write_binary_options.features.gc_enabled_ = s_features.gc_enabled_;
    s_write_binary_options.features.memory64_enabled_ = s_features.memory64_enabled_;
    s_write_binary_options.features.multi_memory_enabled_ = s_features.multi_memory_enabled_;
    script_00 = (Script *)__ptr[-0x28];
    __ptr[-0x2e] = (pointer)0x11edec;
    sVar9 = strlen(s_infile);
    pcVar2 = (char *)__ptr[-0x2d];
    pLVar12 = __ptr[-0x2c];
    ((__uniq_ptr_data<wabt::FileStream,_std::default_delete<wabt::FileStream>,_true,_true> *)
    (__ptr + -0x2f))->
    super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_> =
         (__uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>)
         s_log_stream._M_t.
         super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>._M_t.
         super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>.
         super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl;
    __ptr[-0x30] = (pointer)(__ptr + -0x11);
    __ptr[-0x31] = (pointer)&s_write_binary_options;
    __ptr[-0x32] = (pointer)0x11ee17;
    source_filename._M_str = pcVar6;
    source_filename._M_len = sVar9;
    module_filename_noext._M_str = pcVar2;
    module_filename_noext._M_len = (size_t)pLVar12;
    RVar7 = wabt::WriteBinarySpecScript
                      ((Stream *)(__ptr + -0x23),script_00,source_filename,module_filename_noext,
                       (WriteBinaryOptions *)__ptr[-0x31],
                       (vector<wabt::FilenameMemoryStreamPair,_std::allocator<wabt::FilenameMemoryStreamPair>_>
                        *)__ptr[-0x30],(Stream *)__ptr[-0x2f]);
    iVar10 = 1;
    if (RVar7.enum_ == Ok) {
      __ptr[-0x2e] = (pointer)0x11ee43;
      filename_02._M_str = s_outfile_abi_cxx11_._M_dataplus._M_p;
      filename_02._M_len = s_outfile_abi_cxx11_._M_string_length;
      RVar7 = wabt::OutputBuffer::WriteToFile((OutputBuffer *)__ptr[-0x1f],filename_02);
      if (RVar7.enum_ == Ok) {
        pLVar3 = __ptr[-0x10];
        for (pLVar12 = __ptr[-0x11]; pLVar12 != pLVar3; pLVar12 = (pointer)&pLVar12->last_cr_) {
          _Var4._M_head_impl =
               (pLVar12->source_)._M_t.
               super___uniq_ptr_impl<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_>.
               _M_t.
               super__Tuple_impl<0UL,_wabt::LexerSource_*,_std::default_delete<wabt::LexerSource>_>.
               super__Head_base<0UL,_wabt::LexerSource_*,_false>._M_head_impl;
          pRVar5 = (pLVar12->line_ranges_).
                   super__Vector_base<wabt::Range<unsigned_long>,_std::allocator<wabt::Range<unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          this = *(OutputBuffer **)(pLVar12->next_line_start_ + 0x20);
          __ptr[-0x2e] = (pointer)0x11ee75;
          filename_03._M_str = (char *)_Var4._M_head_impl;
          filename_03._M_len = (size_t)pRVar5;
          RVar7 = wabt::OutputBuffer::WriteToFile(this,filename_03);
          if (RVar7.enum_ != Ok) goto LAB_0011ee81;
        }
        iVar10 = 0;
      }
    }
LAB_0011ee81:
    if (__ptr[-0x2d] != (pointer)unaff_R13) {
      __ptr[-0x2e] = (pointer)0x11ee97;
      operator_delete(__ptr[-0x2d],
                      (ulong)((long)&(__ptr[-0x2b]->source_)._M_t.
                                     super___uniq_ptr_impl<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_wabt::LexerSource_*,_std::default_delete<wabt::LexerSource>_>
                                     .super__Head_base<0UL,_wabt::LexerSource_*,_false>._M_head_impl
                             + 1));
    }
    __ptr[-0x23] = (pointer)&PTR__MemoryStream_0019e838;
    if (__ptr[-0x1f] != (pointer)0x0) {
      __ptr[-0x2e] = (pointer)0x11eebb;
      std::default_delete<wabt::OutputBuffer>::operator()
                ((default_delete<wabt::OutputBuffer> *)(__ptr + -0x1f),(OutputBuffer *)__ptr[-0x1f])
      ;
    }
    __ptr[-0x2e] = (pointer)0x11eec8;
    std::vector<wabt::FilenameMemoryStreamPair,_std::allocator<wabt::FilenameMemoryStreamPair>_>::
    ~vector((vector<wabt::FilenameMemoryStreamPair,_std::allocator<wabt::FilenameMemoryStreamPair>_>
             *)(__ptr + -0x11));
  }
LAB_0011eec8:
  __ptr[-0x2e] = (pointer)0x11eed8;
  wabt::WastLexer::MakeLineFinder((WastLexer *)(__ptr + -0x2d));
  line_finder_00 = __ptr[-0x2d];
  header = (string *)(__ptr + -0x23);
  (header->_M_dataplus)._M_p = (pointer)(__ptr + -0x21);
  __ptr[-0x22] = (pointer)0x0;
  *(undefined1 *)(__ptr + -0x21) = 0;
  __ptr[-0x2f] = (pointer)0x50;
  __ptr[-0x30] = (pointer)0x11ef12;
  wabt::FormatErrorsToFile
            ((Errors *)(__ptr + -0x27),Text,line_finder_00,_stderr,header,Never,
             *(int *)(__ptr + -0x2f));
  ppLVar11 = (pointer *)(header->_M_dataplus)._M_p;
  if (ppLVar11 != __ptr + -0x21) {
    __ptr[-0x2e] = (pointer)0x11ef2b;
    operator_delete(ppLVar11,(ulong)((long)&(__ptr[-0x21]->source_)._M_t.
                                            super___uniq_ptr_impl<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_wabt::LexerSource_*,_std::default_delete<wabt::LexerSource>_>
                                            .super__Head_base<0UL,_wabt::LexerSource_*,_false>.
                                            _M_head_impl + 1));
  }
  if (__ptr[-0x2d] != (LexerSourceLineFinder *)0x0) {
    __ptr[-0x2e] = (pointer)0x11ef3c;
    std::default_delete<wabt::LexerSourceLineFinder>::operator()
              ((default_delete<wabt::LexerSourceLineFinder> *)(__ptr + -0x2d),__ptr[-0x2d]);
  }
  pLVar12 = __ptr[-0x28];
  if (pLVar12 != (pointer)0x0) {
    __ptr[-0x2e] = (pointer)0x11ef4f;
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
                   *)&(pLVar12->line_ranges_).
                      super__Vector_base<wabt::Range<unsigned_long>,_std::allocator<wabt::Range<unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
    __ptr[-0x2e] = (pointer)0x11ef57;
    std::
    vector<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
    ::~vector((vector<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
               *)pLVar12);
    __ptr[-0x2e] = (pointer)0x11ef64;
    operator_delete(pLVar12,0x50);
  }
  if ((WastLexer *)__ptr[-0x29] != (WastLexer *)0x0) {
    __ptr[-0x2e] = (pointer)0x11ef78;
    std::default_delete<wabt::WastLexer>::operator()
              ((default_delete<wabt::WastLexer> *)(__ptr + -0x29),(WastLexer *)__ptr[-0x29]);
  }
  __ptr[-0x2e] = (pointer)0x11ef82;
  std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector
            ((vector<wabt::Error,_std::allocator<wabt::Error>_> *)(__ptr + -0x27));
  pLVar12 = __ptr[-0xd];
  if (pLVar12 != (pointer)0x0) {
    __ptr[-0x2e] = (pointer)0x11ef9f;
    operator_delete(pLVar12,(long)__ptr[-0xb] - (long)pLVar12);
  }
  return iVar10;
}

Assistant:

int ProgramMain(int argc, char** argv) {
  InitStdio();

  ParseOptions(argc, argv);

  std::vector<uint8_t> file_data;
  Result result = ReadFile(s_infile, &file_data);
  Errors errors;
  std::unique_ptr<WastLexer> lexer = WastLexer::CreateBufferLexer(
      s_infile, file_data.data(), file_data.size(), &errors);
  if (Failed(result)) {
    WABT_FATAL("unable to read file: %s\n", s_infile);
  }

  std::unique_ptr<Script> script;
  WastParseOptions parse_wast_options(s_features);
  result = ParseWastScript(lexer.get(), &script, &errors, &parse_wast_options);

  if (Succeeded(result) && s_validate) {
    ValidateOptions options(s_features);
    result = ValidateScript(script.get(), &errors, options);
  }

  if (Succeeded(result)) {
    if (s_outfile.empty()) {
      s_outfile = DefaultOuputName(s_infile);
    }

    std::vector<FilenameMemoryStreamPair> module_streams;
    MemoryStream json_stream;

    std::string output_basename(StripExtension(s_outfile));
    s_write_binary_options.features = s_features;
    result = WriteBinarySpecScript(&json_stream, script.get(), s_infile,
                                   output_basename, s_write_binary_options,
                                   &module_streams, s_log_stream.get());

    if (Succeeded(result)) {
      result = json_stream.WriteToFile(s_outfile);
    }

    if (Succeeded(result)) {
      for (const auto& pair : module_streams) {
        result = pair.stream->WriteToFile(pair.filename);
        if (!Succeeded(result)) {
          break;
        }
      }
    }
  }

  auto line_finder = lexer->MakeLineFinder();
  FormatErrorsToFile(errors, Location::Type::Text, line_finder.get());

  return result != Result::Ok;
}